

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv__pipe_getsockpeername(uv_pipe_t *handle,uv__peersockfunc func,char *buffer,size_t *size)

{
  int iVar1;
  uint uVar2;
  ulong __n;
  int local_9c;
  sockaddr_un sa;
  size_t sVar3;
  
  local_9c = 0x6e;
  sa.sun_family = 0;
  sa.sun_path[0] = '\0';
  sa.sun_path[1] = '\0';
  sa.sun_path[2] = '\0';
  sa.sun_path[3] = '\0';
  sa.sun_path[4] = '\0';
  sa.sun_path[5] = '\0';
  sa.sun_path[6] = '\0';
  sa.sun_path[7] = '\0';
  sa.sun_path[8] = '\0';
  sa.sun_path[9] = '\0';
  sa.sun_path[10] = '\0';
  sa.sun_path[0xb] = '\0';
  sa.sun_path[0xc] = '\0';
  sa.sun_path[0xd] = '\0';
  sa.sun_path[0xe] = '\0';
  sa.sun_path[0xf] = '\0';
  sa.sun_path[0x10] = '\0';
  sa.sun_path[0x11] = '\0';
  sa.sun_path[0x12] = '\0';
  sa.sun_path[0x13] = '\0';
  sa.sun_path[0x14] = '\0';
  sa.sun_path[0x15] = '\0';
  sa.sun_path[0x16] = '\0';
  sa.sun_path[0x17] = '\0';
  sa.sun_path[0x18] = '\0';
  sa.sun_path[0x19] = '\0';
  sa.sun_path[0x1a] = '\0';
  sa.sun_path[0x1b] = '\0';
  sa.sun_path[0x1c] = '\0';
  sa.sun_path[0x1d] = '\0';
  sa.sun_path[0x1e] = '\0';
  sa.sun_path[0x1f] = '\0';
  sa.sun_path[0x20] = '\0';
  sa.sun_path[0x21] = '\0';
  sa.sun_path[0x22] = '\0';
  sa.sun_path[0x23] = '\0';
  sa.sun_path[0x24] = '\0';
  sa.sun_path[0x25] = '\0';
  sa.sun_path[0x26] = '\0';
  sa.sun_path[0x27] = '\0';
  sa.sun_path[0x28] = '\0';
  sa.sun_path[0x29] = '\0';
  sa.sun_path[0x2a] = '\0';
  sa.sun_path[0x2b] = '\0';
  sa.sun_path[0x2c] = '\0';
  sa.sun_path[0x2d] = '\0';
  sa.sun_path[0x2e] = '\0';
  sa.sun_path[0x2f] = '\0';
  sa.sun_path[0x30] = '\0';
  sa.sun_path[0x31] = '\0';
  sa.sun_path[0x32] = '\0';
  sa.sun_path[0x33] = '\0';
  sa.sun_path[0x34] = '\0';
  sa.sun_path[0x35] = '\0';
  sa.sun_path[0x36] = '\0';
  sa.sun_path[0x37] = '\0';
  sa.sun_path[0x38] = '\0';
  sa.sun_path[0x39] = '\0';
  sa.sun_path[0x3a] = '\0';
  sa.sun_path[0x3b] = '\0';
  sa.sun_path[0x3c] = '\0';
  sa.sun_path[0x3d] = '\0';
  sa.sun_path[0x3e] = '\0';
  sa.sun_path[0x3f] = '\0';
  sa.sun_path[0x40] = '\0';
  sa.sun_path[0x41] = '\0';
  sa.sun_path[0x42] = '\0';
  sa.sun_path[0x43] = '\0';
  sa.sun_path[0x44] = '\0';
  sa.sun_path[0x45] = '\0';
  sa.sun_path[0x46] = '\0';
  sa.sun_path[0x47] = '\0';
  sa.sun_path[0x48] = '\0';
  sa.sun_path[0x49] = '\0';
  sa.sun_path[0x4a] = '\0';
  sa.sun_path[0x4b] = '\0';
  sa.sun_path[0x4c] = '\0';
  sa.sun_path[0x4d] = '\0';
  sa.sun_path[0x4e] = '\0';
  sa.sun_path[0x4f] = '\0';
  sa.sun_path[0x50] = '\0';
  sa.sun_path[0x51] = '\0';
  sa.sun_path[0x52] = '\0';
  sa.sun_path[0x53] = '\0';
  sa.sun_path[0x54] = '\0';
  sa.sun_path[0x55] = '\0';
  sa.sun_path[0x56] = '\0';
  sa.sun_path[0x57] = '\0';
  sa.sun_path[0x58] = '\0';
  sa.sun_path[0x59] = '\0';
  sa.sun_path[0x5a] = '\0';
  sa.sun_path[0x5b] = '\0';
  sa.sun_path[0x5c] = '\0';
  sa.sun_path[0x5d] = '\0';
  sa.sun_path[0x5e] = '\0';
  sa.sun_path[0x5f] = '\0';
  sa.sun_path[0x60] = '\0';
  sa.sun_path[0x61] = '\0';
  sa.sun_path[0x62] = '\0';
  sa.sun_path[99] = '\0';
  sa.sun_path[100] = '\0';
  sa.sun_path[0x65] = '\0';
  sa.sun_path[0x66] = '\0';
  sa.sun_path[0x67] = '\0';
  sa.sun_path[0x68] = '\0';
  sa.sun_path[0x69] = '\0';
  sa.sun_path[0x6a] = '\0';
  sa.sun_path[0x6b] = '\0';
  iVar1 = uv__getsockpeername((uv_handle_t *)handle,func,(sockaddr *)&sa,&local_9c);
  if (iVar1 < 0) {
    *size = 0;
  }
  else {
    if (sa.sun_path[0] == '\0') {
      uVar2 = local_9c - 2;
    }
    else {
      sVar3 = strlen(sa.sun_path);
      uVar2 = (uint)sVar3;
    }
    __n = (ulong)uVar2;
    if (__n < *size) {
      memcpy(buffer,sa.sun_path,__n);
      *size = __n;
      iVar1 = 0;
      if (*buffer != '\0') {
        buffer[__n] = '\0';
      }
    }
    else {
      *size = (ulong)(uVar2 + 1);
      iVar1 = -0x69;
    }
  }
  return iVar1;
}

Assistant:

static int uv__pipe_getsockpeername(const uv_pipe_t* handle,
                                    uv__peersockfunc func,
                                    char* buffer,
                                    size_t* size) {
  struct sockaddr_un sa;
  socklen_t addrlen;
  int err;

  addrlen = sizeof(sa);
  memset(&sa, 0, addrlen);
  err = uv__getsockpeername((const uv_handle_t*) handle,
                            func,
                            (struct sockaddr*) &sa,
                            (int*) &addrlen);
  if (err < 0) {
    *size = 0;
    return err;
  }

#if defined(__linux__)
  if (sa.sun_path[0] == 0)
    /* Linux abstract namespace */
    addrlen -= offsetof(struct sockaddr_un, sun_path);
  else
#endif
    addrlen = strlen(sa.sun_path);


  if (addrlen >= *size) {
    *size = addrlen + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, sa.sun_path, addrlen);
  *size = addrlen;

  /* only null-terminate if it's not an abstract socket */
  if (buffer[0] != '\0')
    buffer[addrlen] = '\0';

  return 0;
}